

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O0

void smf_track_add_event_delta_pulses(smf_track_t *track,smf_event_t *event,int delta)

{
  int iVar1;
  int delta_local;
  smf_event_t *event_local;
  smf_track_t *track_local;
  
  if (delta < 0) {
    __assert_fail("delta >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x195,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  if (event->time_pulses == -1) {
    if ((event->time_seconds == -1.0) && (!NAN(event->time_seconds))) {
      if (track->smf != (smf_t *)0x0) {
        iVar1 = last_event_pulses(track);
        smf_track_add_event_pulses(track,event,iVar1 + delta);
        return;
      }
      __assert_fail("track->smf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x198,
                    "void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)");
    }
    __assert_fail("event->time_seconds == -1.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x197,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)")
    ;
  }
  __assert_fail("event->time_pulses == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                ,0x196,"void smf_track_add_event_delta_pulses(smf_track_t *, smf_event_t *, int)");
}

Assistant:

void
smf_track_add_event_delta_pulses(smf_track_t *track, smf_event_t *event, int delta)
{
	assert(delta >= 0);
	assert(event->time_pulses == -1);
	assert(event->time_seconds == -1.0);
	assert(track->smf != NULL);

	smf_track_add_event_pulses(track, event, last_event_pulses(track) + delta);
}